

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

size_t push_elements_bytes_size(wally_tx_output *out)

{
  long local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t size;
  wally_tx_output *out_local;
  
  if (out->asset_len == 0) {
    local_20 = 1;
  }
  else {
    local_20 = out->asset_len;
  }
  if (out->value_len == 0) {
    local_28 = 1;
  }
  else {
    local_28 = out->value_len;
  }
  if (out->nonce_len == 0) {
    local_30 = 1;
  }
  else {
    local_30 = out->nonce_len;
  }
  if (out->script_len == 0) {
    local_38 = 1;
  }
  else {
    local_38 = out->script_len + 1;
  }
  return local_38 + local_30 + local_28 + local_20;
}

Assistant:

static size_t push_elements_bytes_size(const struct wally_tx_output *out)
{
    size_t size = 0;
    size += out->asset_len == 0 ? 1 : out->asset_len;
    size += out->value_len == 0 ? 1 : out->value_len;
    size += out->nonce_len == 0 ? 1 : out->nonce_len;
    size += out->script_len == 0 ? 1 : out->script_len + 1;
    return size;
}